

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O2

int csp_id2_strip(csp_packet_t *packet)

{
  ulong uVar1;
  uint6 uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (packet->frame_length < 6) {
    return -1;
  }
  uVar2 = *(uint6 *)packet->frame_begin;
  uVar3 = (ulong)*(ushort *)((long)packet->frame_begin + 4) << 0x20;
  uVar4 = (ulong)uVar2;
  packet->length = packet->frame_length - 6;
  uVar1 = uVar3 & 0xff0000000000;
  uVar3 = uVar1 >> 0x18 | (uVar3 & 0xff00000000) >> 8;
  uVar4 = uVar3 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
          | uVar4 << 0x38;
  (packet->id).pri = (byte)uVar2 >> 6;
  (packet->id).dst = (ushort)(uVar4 >> 0x30) & 0x3fff;
  (packet->id).src = (ushort)(uint)(uVar4 >> 0x22) & 0x3fff;
  (packet->id).dport = (byte)(uVar4 >> 0x1c) & 0x3f;
  (packet->id).sport = (byte)((uint)uVar3 >> 0x16) & 0x3f;
  (packet->id).flags = (byte)(uVar1 >> 0x28) & 0x3f;
  return 0;
}

Assistant:

static int csp_id2_strip(csp_packet_t * packet) {

	if (packet->frame_length < CSP_ID2_HEADER_SIZE) {
		return -1;
	}

	/* Get 48 bit in network byte order:
	 * Most significant byte ends in byte 0 */
	uint64_t id2 = 0;
	memcpy(&id2, packet->frame_begin, CSP_ID2_HEADER_SIZE);
	packet->length = packet->frame_length - CSP_ID2_HEADER_SIZE;

	/* Convert to host order:
	 * Most significant byte ends in byte 7, we then shift down
	 * to get MSB into byte 5 */
	id2 = be64toh(id2) >> 16;

	/* Parse header:
	 * Now in easy to work with in 32 bit register */
	packet->id.pri = (id2 >> CSP_ID2_PRIO_OFFSET) & CSP_ID2_PRIO_MASK;
	packet->id.dst = (id2 >> CSP_ID2_DST_OFFSET) & CSP_ID2_DST_MASK;
	packet->id.src = (id2 >> CSP_ID2_SRC_OFFSET) & CSP_ID2_SRC_MASK;
	packet->id.dport = (id2 >> CSP_ID2_DPORT_OFFSET) & CSP_ID2_DPORT_MASK;
	packet->id.sport = (id2 >> CSP_ID2_SPORT_OFFSET) & CSP_ID2_SPORT_MASK;
	packet->id.flags = (id2 >> CSP_ID2_FLAGS_OFFSET) & CSP_ID2_FLAGS_MASK;

	return 0;
}